

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_RhsCleared_Test::
~GeneratedMessageReflectionSwapTest_RhsCleared_Test
          (GeneratedMessageReflectionSwapTest_RhsCleared_Test *this)

{
  GeneratedMessageReflectionSwapTest_RhsCleared_Test *this_local;
  
  ~GeneratedMessageReflectionSwapTest_RhsCleared_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, RhsCleared) {
  unittest::TestAllTypes lhs;
  unittest::TestAllTypes rhs;

  TestUtil::SetAllFields(&rhs);

  // For proto2 message, for message field, Clear only reset hasbits, but
  // doesn't delete the underlying field.
  rhs.Clear();

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectClear(lhs);
}